

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

bool __thiscall args::Group::HasFlag(Group *this)

{
  Base **ppBVar1;
  __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
  _Var2;
  
  ppBVar1 = (this->children).super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<args::Base*const*,std::vector<args::Base*,std::allocator<args::Base*>>>,__gnu_cxx::__ops::_Iter_pred<args::Group::HasFlag()const::_lambda(args::Base*)_1_>>
                    ((this->children).
                     super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
                     super__Vector_impl_data._M_start,ppBVar1);
  return _Var2._M_current != ppBVar1;
}

Assistant:

std::vector<std::string> MapKeysToStrings(const T &map)
        {
            std::vector<std::string> res;
            using K = typename std::decay<decltype(std::begin(map)->first)>::type;
            if (IsConvertableToString<K>::value)
            {
                for (const auto &p : map)
                {
                    res.push_back(detail::ToString(p.first));
                }

                std::sort(res.begin(), res.end());
            }
            return res;
        }